

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::AnyMetadata::InternalIs(AnyMetadata *this,StringPiece type_name)

{
  string *psVar1;
  bool bVar2;
  StringPiece type_url;
  StringPiece local_68;
  StringPiece local_58;
  string local_48;
  string local_28;
  
  local_58.length_ = type_name.length_;
  local_58.ptr_ = type_name.ptr_;
  psVar1 = this->type_url_->ptr_;
  local_68.ptr_ = (psVar1->_M_dataplus)._M_p;
  local_68.length_ = psVar1->_M_string_length;
  if ((local_58.length_ < local_68.length_) &&
     (local_68.ptr_[~local_58.length_ + local_68.length_] == '/')) {
    StringPiece::ToString_abi_cxx11_(&local_28,&local_68);
    StringPiece::ToString_abi_cxx11_(&local_48,&local_58);
    bVar2 = HasSuffixString(&local_28,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AnyMetadata::InternalIs(StringPiece type_name) const {
  StringPiece type_url = Get(type_url_);
  return type_url.size() >= type_name.size() + 1 &&
         type_url[type_url.size() - type_name.size() - 1] == '/' &&
         HasSuffixString(type_url, type_name);
}